

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::UpdateConversionPathTable(cmake *this)

{
  cmState *this_00;
  string *__rhs;
  long *plVar1;
  ulong *puVar2;
  string a;
  string b;
  ifstream table;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  byte abStack_210 [488];
  
  this_00 = this->State;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"CMAKE_PATH_TRANSLATION_FILE","");
  __rhs = cmState::GetInitializedCacheValue(this_00,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if (__rhs != (string *)0x0) {
    std::ifstream::ifstream(&local_230,(__rhs->_M_dataplus)._M_p,_S_in);
    if ((abStack_210[*(long *)(local_230._M_dataplus._M_p + -0x18)] & 5) == 0) {
      local_270._M_string_length = 0;
      local_270.field_2._M_allocated_capacity =
           local_270.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_250._M_string_length = 0;
      local_250.field_2._M_local_buf[0] = '\0';
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      while ((abStack_210[*(long *)(local_230._M_dataplus._M_p + -0x18)] & 2) == 0) {
        std::operator>>((istream *)&local_230,(string *)&local_270);
        std::operator>>((istream *)&local_230,(string *)&local_250);
        cmsys::SystemTools::AddTranslationPath(&local_270,&local_250);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,
                        CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                                 local_250.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::operator+(&local_250,"CMAKE_PATH_TRANSLATION_FILE set to ",__rhs);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_250);
      puVar2 = (ulong *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2) {
        local_270.field_2._M_allocated_capacity = *puVar2;
        local_270.field_2._8_8_ = plVar1[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar2;
        local_270._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_270._M_string_length = plVar1[1];
      *plVar1 = (long)puVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      cmSystemTools::Error(&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,
                        CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                                 local_250.field_2._M_local_buf[0]) + 1);
      }
      cmSystemTools::ReportLastSystemError("CMake can not open file.");
    }
    std::ifstream::~ifstream(&local_230);
  }
  return;
}

Assistant:

void cmake::UpdateConversionPathTable()
{
  // Update the path conversion table with any specified file:
  const std::string* tablepath =
    this->State->GetInitializedCacheValue("CMAKE_PATH_TRANSLATION_FILE");

  if (tablepath) {
    cmsys::ifstream table(tablepath->c_str());
    if (!table) {
      cmSystemTools::Error("CMAKE_PATH_TRANSLATION_FILE set to " + *tablepath +
                           ". CMake can not open file.");
      cmSystemTools::ReportLastSystemError("CMake can not open file.");
    } else {
      std::string a, b;
      while (!table.eof()) {
        // two entries per line
        table >> a;
        table >> b;
        cmSystemTools::AddTranslationPath(a, b);
      }
    }
  }
}